

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * QUnicodeTables::detachAndConvertCase<QString>
                    (QString *__return_storage_ptr__,QString *str,QStringIterator it,Case which)

{
  char16_t cVar1;
  Data *pDVar2;
  const_iterator pQVar3;
  ulong uVar4;
  qsizetype qVar5;
  char cVar6;
  ulong uVar7;
  char32_t uc;
  char16_t *pcVar8;
  long lVar9;
  long in_FS_OFFSET;
  QSpan<unsigned_long,_18446744073709551615UL> indices;
  R_conflict3 RVar10;
  QStringView after;
  const_iterator local_60;
  const_iterator local_58;
  ulong local_50;
  char16_t local_48 [4];
  undefined2 local_40;
  QString *local_38;
  
  local_38 = *(QString **)(in_FS_OFFSET + 0x28);
  pDVar2 = (str->d).d;
  (str->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).d = pDVar2;
  local_58 = (const_iterator)(str->d).ptr;
  (str->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)local_58;
  qVar5 = (str->d).size;
  (str->d).size = 0;
  (__return_storage_ptr__->d).size = qVar5;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(__return_storage_ptr__,qVar5,KeepSize);
    local_58 = (const_iterator)(__return_storage_ptr__->d).ptr;
  }
  local_60 = it.i;
  pcVar8 = (char16_t *)(((long)it.pos - (long)it.i) + (long)local_58);
  do {
    pQVar3 = it.pos + 1;
    local_48 = (char16_t  [4])&DAT_aaaaaaaaaaaaaaaa;
    local_40 = 0xaaaa;
    cVar1 = (it.pos)->ucs;
    uc = (char32_t)(ushort)cVar1;
    if (((((cVar1 & 0xf800U) == 0xd800) && (uc = L'�', (cVar1 & 0xdc00U) == 0xd800)) &&
        (pQVar3 < it.e)) && ((pQVar3->ucs & 0xfc00U) == 0xdc00)) {
      uc = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)pQVar3->ucs + L'\xfca02400';
      pQVar3 = it.pos + 2;
    }
    it.pos = pQVar3;
    RVar10 = fullConvertCase(uc,which);
    cVar6 = RVar10.sz;
    local_48 = RVar10.chars;
    local_40 = CONCAT11(local_40._1_1_,cVar6);
    if (cVar6 < '\x02') {
      *pcVar8 = RVar10.chars[0];
      pcVar8 = pcVar8 + 1;
    }
    else if ((cVar6 == '\x02') && (*pcVar8 == RVar10.chars[0])) {
      pcVar8[1] = RVar10.chars[1];
      pcVar8 = pcVar8 + 2;
    }
    else {
      lVar9 = (long)pcVar8 - (long)local_58;
      uVar7 = lVar9 >> 1;
      uVar4 = (__return_storage_ptr__->d).size;
      qVar5 = uVar4 - uVar7;
      if (uVar7 <= uVar4) {
        if (0 < qVar5) {
          qVar5 = 1;
        }
        indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_size = 1;
        indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_data = &local_50;
        after.m_size._0_1_ = cVar6;
        after.m_data = local_48;
        after.m_size._1_7_ = 0;
        local_50 = uVar7;
        replace_helper(__return_storage_ptr__,indices,qVar5,after);
        local_58 = (const_iterator)(__return_storage_ptr__->d).ptr;
        uVar4 = (__return_storage_ptr__->d).size;
        cVar6 = (char)local_40;
      }
      pcVar8 = (char16_t *)((long)local_58 + (long)cVar6 * 2 + lVar9);
      it.e = local_58 + uVar4;
      it.pos = (const_iterator)
               ((long)local_58 + (long)it.pos + (long)cVar6 * 2 + (-2 - (long)local_60));
      local_60 = local_58;
    }
  } while (it.pos < it.e);
  if (*(QString **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(QString **)(in_FS_OFFSET + 0x28);
}

Assistant:

Q_NEVER_INLINE
static QString detachAndConvertCase(T &str, QStringIterator it, QUnicodeTables::Case which)
{
    Q_ASSERT(!str.isEmpty());
    QString s = std::move(str);         // will copy if T is const QString
    QChar *pp = s.begin() + it.index(); // will detach if necessary

    do {
        const auto folded = fullConvertCase(it.next(), which);
        if (Q_UNLIKELY(folded.size() > 1)) {
            if (folded.chars[0] == *pp && folded.size() == 2) {
                // special case: only second actually changed (e.g. surrogate pairs),
                // avoid slow case
                ++pp;
                *pp++ = folded.chars[1];
            } else {
                // slow path: the string is growing
                qsizetype inpos = it.index() - 1;
                qsizetype outpos = pp - s.constBegin();

                s.replace(outpos, 1, reinterpret_cast<const QChar *>(folded.data()), folded.size());
                pp = const_cast<QChar *>(s.constBegin()) + outpos + folded.size();

                // Adjust the input iterator if we are performing an in-place conversion
                if constexpr (!std::is_const<T>::value)
                    it = QStringIterator(s.constBegin(), inpos + folded.size(), s.constEnd());
            }
        } else {
            *pp++ = folded.chars[0];
        }
    } while (it.hasNext());

    return s;
}